

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

VkBufferImageCopy *
Diligent::GetBufferImageCopyInfo
          (VkBufferImageCopy *__return_storage_ptr__,Uint64 BufferOffset,
          Uint32 BufferRowStrideInTexels,TextureDesc *TexDesc,Box *Region,Uint32 MipLevel,
          Uint32 ArraySlice)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  TextureFormatAttribs *pTVar8;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  string msg;
  
  (__return_storage_ptr__->imageOffset).x = 0;
  (__return_storage_ptr__->imageOffset).y = 0;
  *(undefined8 *)&(__return_storage_ptr__->imageOffset).z = 0;
  (__return_storage_ptr__->imageSubresource).aspectMask = 0;
  (__return_storage_ptr__->imageSubresource).mipLevel = 0;
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = 0;
  (__return_storage_ptr__->imageSubresource).layerCount = 0;
  __return_storage_ptr__->bufferOffset = 0;
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  (__return_storage_ptr__->imageExtent).height = 0;
  (__return_storage_ptr__->imageExtent).depth = 0;
  if ((BufferOffset & 3) != 0) {
    FormatString<char[50]>(&msg,(char (*) [50])"Source buffer offset must be multiple of 4 (18.4)");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa09);
    in_stack_ffffffffffffffac = MipLevel;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      in_stack_ffffffffffffffac = MipLevel;
    }
  }
  __return_storage_ptr__->bufferOffset = BufferOffset;
  __return_storage_ptr__->bufferRowLength = BufferRowStrideInTexels;
  __return_storage_ptr__->bufferImageHeight = 0;
  pTVar8 = GetTextureFormatAttribs(TexDesc->Format);
  if (pTVar8->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
    FormatString<char[58]>
              (&msg,(char (*) [58])"Updating depth-stencil texture is not currently supported");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  else if (pTVar8->ComponentType == COMPONENT_TYPE_DEPTH) {
    (__return_storage_ptr__->imageSubresource).aspectMask = 2;
  }
  else {
    (__return_storage_ptr__->imageSubresource).aspectMask = 1;
  }
  (__return_storage_ptr__->imageSubresource).baseArrayLayer = ArraySlice;
  (__return_storage_ptr__->imageSubresource).layerCount = 1;
  (__return_storage_ptr__->imageSubresource).mipLevel = MipLevel;
  uVar1 = Region->MinX;
  uVar2 = Region->MinY;
  uVar3 = Region->MinZ;
  (__return_storage_ptr__->imageOffset).x = uVar1;
  (__return_storage_ptr__->imageOffset).y = uVar2;
  (__return_storage_ptr__->imageOffset).z = uVar3;
  if (((Region->MaxX <= uVar1) || (Region->MaxY <= uVar2)) || (Region->MaxZ <= uVar3)) {
    FormatString<char[2],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[24]>
              (&msg,(Diligent *)0x77211d,(char (*) [2])Region,(uint *)0x6d8549,
               (char (*) [5])&Region->MaxX,(uint *)") x [",(char (*) [6])&Region->MinY,
               (uint *)0x6d8549,(char (*) [5])&Region->MaxY,(uint *)") x [",
               (char (*) [6])&Region->MinZ,(uint *)0x6d8549,(char (*) [5])&Region->MaxZ,
               (uint *)") is not a valid region",
               (char (*) [24])CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferImageCopyInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xa31);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  UVar4 = Region->MaxY;
  UVar5 = Region->MinY;
  UVar6 = Region->MaxZ;
  UVar7 = Region->MinZ;
  (__return_storage_ptr__->imageExtent).width = Region->MaxX - Region->MinX;
  (__return_storage_ptr__->imageExtent).height = UVar4 - UVar5;
  (__return_storage_ptr__->imageExtent).depth = UVar6 - UVar7;
  return __return_storage_ptr__;
}

Assistant:

static VkBufferImageCopy GetBufferImageCopyInfo(Uint64             BufferOffset,
                                                Uint32             BufferRowStrideInTexels,
                                                const TextureDesc& TexDesc,
                                                const Box&         Region,
                                                Uint32             MipLevel,
                                                Uint32             ArraySlice)
{
    VkBufferImageCopy CopyRegion = {};
    VERIFY((BufferOffset % 4) == 0, "Source buffer offset must be multiple of 4 (18.4)");
    CopyRegion.bufferOffset = BufferOffset; // must be a multiple of 4 (18.4)

    // bufferRowLength and bufferImageHeight specify the data in buffer memory as a subregion of a larger two- or
    // three-dimensional image, and control the addressing calculations of data in buffer memory. If either of these
    // values is zero, that aspect of the buffer memory is considered to be tightly packed according to the imageExtent (18.4).
    CopyRegion.bufferRowLength   = BufferRowStrideInTexels;
    CopyRegion.bufferImageHeight = 0;

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
    // The aspectMask member of imageSubresource must only have a single bit set (18.4)
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH)
        CopyRegion.imageSubresource.aspectMask = VK_IMAGE_ASPECT_DEPTH_BIT;
    else if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
    {
        UNSUPPORTED("Updating depth-stencil texture is not currently supported");
        // When copying to or from a depth or stencil aspect, the data in buffer memory uses a layout
        // that is a (mostly) tightly packed representation of the depth or stencil data.
        // To copy both the depth and stencil aspects of a depth/stencil format, two entries in
        // pRegions can be used, where one specifies the depth aspect in imageSubresource, and the
        // other specifies the stencil aspect.
    }
    else
        CopyRegion.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;

    CopyRegion.imageSubresource.baseArrayLayer = ArraySlice;
    CopyRegion.imageSubresource.layerCount     = 1;
    CopyRegion.imageSubresource.mipLevel       = MipLevel;
    // - imageOffset.x and (imageExtent.width + imageOffset.x) must both be greater than or equal to 0 and
    //   less than or equal to the image subresource width (18.4)
    // - imageOffset.y and (imageExtent.height + imageOffset.y) must both be greater than or equal to 0 and
    //   less than or equal to the image subresource height (18.4)
    CopyRegion.imageOffset =
        VkOffset3D //
        {
            static_cast<int32_t>(Region.MinX),
            static_cast<int32_t>(Region.MinY),
            static_cast<int32_t>(Region.MinZ) //
        };
    VERIFY(Region.IsValid(),
           "[", Region.MinX, " .. ", Region.MaxX, ") x [", Region.MinY, " .. ", Region.MaxY, ") x [", Region.MinZ, " .. ", Region.MaxZ, ") is not a valid region");
    CopyRegion.imageExtent =
        VkExtent3D //
        {
            static_cast<uint32_t>(Region.Width()),
            static_cast<uint32_t>(Region.Height()),
            static_cast<uint32_t>(Region.Depth()) //
        };

    return CopyRegion;
}